

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Nonlin.c
# Opt level: O0

int Llb_NonlinReachability(Llb_Mnn_t *p)

{
  DdManager *pDVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  abctime aVar7;
  DdNode *pDVar8;
  DdManager *pDVar9;
  abctime aVar10;
  int *piVar11;
  Abc_Cex_t *pAVar12;
  abctime aVar13;
  DdNode *pDVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  long local_60;
  double nMints;
  abctime clk;
  abctime clk3;
  abctime clk2;
  int NumCmp;
  int nBddSize;
  int nBddSize0;
  int nIters;
  DdNode *bNext;
  DdNode *bTemp;
  Llb_Mnn_t *p_local;
  
  clk2._4_4_ = 0xffffffff;
  aVar6 = Abc_Clock();
  iVar2 = Aig_ManRegNum(p->pAig);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1b2,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  if (p->pPars->TimeLimit == 0) {
    local_60 = 0;
  }
  else {
    iVar2 = p->pPars->TimeLimit;
    aVar7 = Abc_Clock();
    local_60 = (long)iVar2 * 1000000 + aVar7;
  }
  p->pPars->TimeTarget = local_60;
  p->dd->TimeStop = p->pPars->TimeTarget;
  p->ddG->TimeStop = p->pPars->TimeTarget;
  p->ddR->TimeStop = p->pPars->TimeTarget;
  if (p->dd->bFunc != (DdNode *)0x0) {
    __assert_fail("p->dd->bFunc == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                  ,0x1bd,"int Llb_NonlinReachability(Llb_Mnn_t *)");
  }
  pDVar8 = Llb_BddComputeBad(p->pInit,p->ddR,p->pPars->TimeTarget);
  p->ddR->bFunc = pDVar8;
  if (p->ddR->bFunc == (DdNode *)0x0) {
    if (p->pPars->fSilent == 0) {
      printf("Reached timeout (%d seconds) during constructing the bad states.\n",
             (ulong)(uint)p->pPars->TimeLimit);
    }
    p->pPars->iFrame = -1;
    p_local._4_4_ = -1;
  }
  else {
    Cudd_Ref(p->ddR->bFunc);
    Cudd_Quit(p->dd);
    pDVar9 = Llb_NonlinImageStart
                       (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,1,p->pPars->TimeTarget);
    p->dd = pDVar9;
    if (p->dd == (DdManager *)0x0) {
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during constructing the bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      p->pPars->iFrame = -1;
      p_local._4_4_ = -1;
    }
    else {
      pDVar8 = Llb_NonlinComputeInitState(p->pAig,p->dd);
      p->dd->bFunc = pDVar8;
      Cudd_Ref(p->dd->bFunc);
      pDVar8 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc = pDVar8;
      Cudd_Ref(p->ddG->bFunc);
      pDVar8 = Llb_NonlinComputeInitState(p->pAig,p->ddG);
      p->ddG->bFunc2 = pDVar8;
      Cudd_Ref(p->ddG->bFunc2);
      for (nBddSize = 0; nBddSize < p->pPars->nIterMax; nBddSize = nBddSize + 1) {
        aVar7 = Abc_Clock();
        if ((p->pPars->TimeLimit != 0) && (aVar10 = Abc_Clock(), p->pPars->TimeTarget < aVar10)) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Llb_NonlinImageQuit();
          return -1;
        }
        pDVar9 = p->dd;
        pDVar1 = p->ddR;
        pDVar8 = p->dd->bFunc;
        piVar11 = Vec_IntArray(p->vCs2Glo);
        pDVar8 = Extra_TransferPermute(pDVar9,pDVar1,pDVar8,piVar11);
        if (pDVar8 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during ring transfer.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Llb_NonlinImageQuit();
          return -1;
        }
        Cudd_Ref(pDVar8);
        Vec_PtrPush(p->vRings,pDVar8);
        if ((p->pPars->fSkipOutCheck == 0) &&
           (iVar2 = Cudd_bddLeq(p->ddR,pDVar8,(DdNode *)((ulong)p->ddR->bFunc ^ 1)), iVar2 == 0)) {
          if (p->pInit->pSeqModel == (Abc_Cex_t *)0x0) {
            if (p->pPars->fBackward == 0) {
              pAVar12 = Llb_NonlinDeriveCex(p);
              p->pInit->pSeqModel = pAVar12;
            }
            if (p->pPars->fSilent == 0) {
              if (p->pPars->fBackward == 0) {
                Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                          (ulong)(uint)p->pInit->pSeqModel->iPo,(ulong)(uint)nBddSize);
              }
              else {
                Abc_Print(1,
                          "Output ??? was asserted in frame %d (counter-example is not produced).  "
                          ,(ulong)(uint)nBddSize);
              }
              aVar7 = Abc_Clock();
              Abc_PrintTime(1,"Time",aVar7 - aVar6);
            }
            p->pPars->iFrame = nBddSize + -1;
            Llb_NonlinImageQuit();
            return 0;
          }
          __assert_fail("p->pInit->pSeqModel == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Nonlin.c"
                        ,0x1f5,"int Llb_NonlinReachability(Llb_Mnn_t *)");
        }
        aVar10 = Abc_Clock();
        uVar3 = Cudd_DagSize(p->dd->bFunc);
        pDVar8 = Llb_NonlinImageCompute(p->dd->bFunc,p->pPars->fReorder,0,1,p->pOrderL);
        if (pDVar8 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in quantification.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Llb_NonlinImageQuit();
          return -1;
        }
        Cudd_Ref(pDVar8);
        clk2._4_4_ = Cudd_DagSize(pDVar8);
        aVar13 = Abc_Clock();
        p->timeImage = (aVar13 - aVar10) + p->timeImage;
        aVar10 = Abc_Clock();
        Cudd_RecursiveDeref(p->ddG,p->ddG->bFunc2);
        pDVar9 = p->dd;
        pDVar1 = p->ddG;
        piVar11 = Vec_IntArray(p->vNs2Glo);
        pDVar14 = Extra_TransferPermute(pDVar9,pDVar1,pDVar8,piVar11);
        p->ddG->bFunc2 = pDVar14;
        if (p->ddG->bFunc2 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Cudd_RecursiveDeref(p->dd,pDVar8);
          Llb_NonlinImageQuit();
          return -1;
        }
        Cudd_Ref(p->ddG->bFunc2);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        aVar13 = Abc_Clock();
        p->timeTran1 = (aVar13 - aVar10) + p->timeTran1;
        uVar4 = Llb_NonlinCompPerms(p->dd,p->pOrderL2);
        memcpy(p->pOrderL2,p->dd->perm,(long)p->dd->size << 2);
        lVar15 = Cudd_ReadReorderingTime(p->dd);
        p->timeReo = lVar15 + p->timeReo;
        iVar2 = Cudd_ReadReorderings(p->dd);
        p->ddLocReos = iVar2 + p->ddLocReos;
        iVar2 = Cudd_ReadGarbageCollections(p->dd);
        p->ddLocGrbs = iVar2 + p->ddLocGrbs;
        Llb_NonlinImageQuit();
        pDVar9 = Llb_NonlinImageStart
                           (p->pAig,p->vLeaves,p->vRoots,p->pVars2Q,p->pOrderL,0,
                            p->pPars->TimeTarget);
        p->dd = pDVar9;
        if (p->dd == (DdManager *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during constructing the bad states.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          return -1;
        }
        aVar10 = Abc_Clock();
        pDVar8 = p->ddG->bFunc2;
        pDVar14 = Cudd_bddAnd(p->ddG,pDVar8,(DdNode *)((ulong)p->ddG->bFunc ^ 1));
        p->ddG->bFunc2 = pDVar14;
        if (p->ddG->bFunc2 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Cudd_RecursiveDeref(p->ddG,pDVar8);
          Llb_NonlinImageQuit();
          return -1;
        }
        Cudd_Ref(p->ddG->bFunc2);
        Cudd_RecursiveDeref(p->ddG,pDVar8);
        aVar13 = Abc_Clock();
        p->timeGloba = (aVar13 - aVar10) + p->timeGloba;
        if (*(int *)((ulong)p->ddG->bFunc2 & 0xfffffffffffffffe) == 0x7fffffff) break;
        aVar10 = Abc_Clock();
        pDVar8 = p->ddG->bFunc;
        pDVar14 = Cudd_bddOr(p->ddG,pDVar8,p->ddG->bFunc2);
        p->ddG->bFunc = pDVar14;
        if (p->ddG->bFunc == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Cudd_RecursiveDeref(p->ddG,pDVar8);
          Llb_NonlinImageQuit();
          return -1;
        }
        Cudd_Ref(p->ddG->bFunc);
        Cudd_RecursiveDeref(p->ddG,pDVar8);
        aVar13 = Abc_Clock();
        p->timeGloba = (aVar13 - aVar10) + p->timeGloba;
        aVar10 = Abc_Clock();
        pDVar9 = p->ddG;
        pDVar1 = p->dd;
        pDVar8 = p->ddG->bFunc2;
        piVar11 = Vec_IntArray(p->vGlo2Cs);
        pDVar8 = Extra_TransferPermute(pDVar9,pDVar1,pDVar8,piVar11);
        p->dd->bFunc = pDVar8;
        if (p->dd->bFunc == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          p->pPars->iFrame = nBddSize + -1;
          Llb_NonlinImageQuit();
          return -1;
        }
        Cudd_Ref(p->dd->bFunc);
        aVar13 = Abc_Clock();
        p->timeTran2 = (aVar13 - aVar10) + p->timeTran2;
        if (p->pPars->fVerbose != 0) {
          printf("I =%3d : ",(ulong)(uint)nBddSize);
          printf("Fr =%7d ",(ulong)uVar3);
          printf("Im =%7d  ",(ulong)clk2._4_4_);
          printf("(%4d %4d)  ",(ulong)(uint)p->ddLocReos,(ulong)(uint)p->ddLocGrbs);
          uVar3 = Cudd_DagSize(p->ddG->bFunc);
          printf("Rea =%6d  ",(ulong)uVar3);
          uVar3 = Cudd_ReadReorderings(p->ddG);
          uVar5 = Cudd_ReadGarbageCollections(p->ddG);
          printf("(%4d %4d)  ",(ulong)uVar3,(ulong)uVar5);
          printf("S =%4d ",(ulong)(uint)nSuppMax);
          printf("cL =%5d ",(ulong)uVar4);
          uVar3 = Llb_NonlinCompPerms(p->ddG,p->pOrderG);
          printf("cG =%5d ",(ulong)uVar3);
          aVar10 = Abc_Clock();
          Abc_PrintTime(1,"T",aVar10 - aVar7);
          memcpy(p->pOrderG,p->ddG->perm,(long)p->ddG->size << 2);
        }
        if (nBddSize == p->pPars->nIterMax + -1) {
          if (p->pPars->fSilent == 0) {
            printf("Reached limit on the number of timeframes (%d).\n",
                   (ulong)(uint)p->pPars->nIterMax);
          }
          p->pPars->iFrame = nBddSize;
          Llb_NonlinImageQuit();
          return -1;
        }
      }
      Llb_NonlinImageQuit();
      if (p->pPars->fVerbose != 0) {
        pDVar9 = p->ddG;
        pDVar8 = p->ddG->bFunc;
        iVar2 = Saig_ManRegNum(p->pAig);
        dVar16 = Cudd_CountMinterm(pDVar9,pDVar8,iVar2);
        if ((nBddSize < p->pPars->nIterMax) && ((int)clk2._4_4_ <= p->pPars->nBddMax)) {
          printf("Reachability analysis completed after %d frames.\n",(ulong)(uint)nBddSize);
        }
        else {
          printf("Reachability analysis is stopped after %d frames.\n",(ulong)(uint)nBddSize);
        }
        iVar2 = Saig_ManRegNum(p->pAig);
        dVar17 = pow(2.0,(double)iVar2);
        printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar16,(dVar16 * 100.0) / dVar17);
        fflush(_stdout);
      }
      if ((nBddSize < p->pPars->nIterMax) && ((int)clk2._4_4_ <= p->pPars->nBddMax)) {
        if (p->pPars->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)(uint)nBddSize);
        }
        p->pPars->iFrame = nBddSize + -1;
        aVar7 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar7 - aVar6);
        p_local._4_4_ = 1;
      }
      else {
        if (p->pPars->fSilent == 0) {
          printf("Verified only for states reachable in %d frames.  ",(ulong)(uint)nBddSize);
        }
        p->pPars->iFrame = p->pPars->nIterMax;
        p_local._4_4_ = -1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Llb_NonlinReachability( Llb_Mnn_t * p )
{ 
    DdNode * bTemp, * bNext;
    int nIters, nBddSize0, nBddSize = -1, NumCmp;//, Limit = p->pPars->nBddMax;
    abctime clk2, clk3, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // set reordering hooks
    assert( p->dd->bFunc == NULL );
//    p->dd->bFunc = (DdNode *)p->pAig;
//    Cudd_AddHook( p->dd, Llb_NonlinReoHook, CUDD_POST_REORDERING_HOOK );

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pInit, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );
    // compute the starting set of states
    Cudd_Quit( p->dd );
    p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 1, p->pPars->TimeTarget );
    if ( p->dd == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    p->dd->bFunc   = Llb_NonlinComputeInitState( p->pAig, p->dd );   Cudd_Ref( p->dd->bFunc );   // current
    p->ddG->bFunc  = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc );  // reached
    p->ddG->bFunc2 = Llb_NonlinComputeInitState( p->pAig, p->ddG );  Cudd_Ref( p->ddG->bFunc2 ); // frontier 
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        // check the runtime limit
        clk2 = Abc_Clock();
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, p->dd->bFunc, Vec_IntArray(p->vCs2Glo) );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pInit->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pInit->pSeqModel = Llb_NonlinDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pInit->pSeqModel->iPo, nIters );
                else
                    Abc_Print( 1, "Output ??? was asserted in frame %d (counter-example is not produced).  ", nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return 0;
        }

        // compute the next states
        clk3 = Abc_Clock();
        nBddSize0 = Cudd_DagSize( p->dd->bFunc );
        bNext = Llb_NonlinImageCompute( p->dd->bFunc, p->pPars->fReorder, 0, 1, p->pOrderL ); // consumes ref   
//        bNext = Llb_NonlinImage( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->dd, bCurrent, 
//            p->pPars->fReorder, p->pPars->fVeryVerbose, NULL, ABC_INFINITY, p->pPars->TimeTarget );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( bNext );
        nBddSize = Cudd_DagSize( bNext );
        p->timeImage += Abc_Clock() - clk3;


        // transfer to the state manager
        clk3 = Abc_Clock();
        Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc2 );
        p->ddG->bFunc2 = Extra_TransferPermute( p->dd, p->ddG, bNext, Vec_IntArray(p->vNs2Glo) );    
//        p->ddG->bFunc2 = Extra_bddAndPermute( p->ddG, Cudd_Not(p->ddG->bFunc), p->dd, bNext, Vec_IntArray(p->vNs2Glo) );    
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bNext );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->dd, bNext );
        p->timeTran1 += Abc_Clock() - clk3;

        // save permutation
        NumCmp = Llb_NonlinCompPerms( p->dd, p->pOrderL2 );
        // save order before image computation
        memcpy( p->pOrderL2, p->dd->perm, sizeof(int) * p->dd->size );
        // update the image computation manager
        p->timeReo   += Cudd_ReadReorderingTime(p->dd);
        p->ddLocReos += Cudd_ReadReorderings(p->dd);
        p->ddLocGrbs += Cudd_ReadGarbageCollections(p->dd);
        Llb_NonlinImageQuit();
        p->dd = Llb_NonlinImageStart( p->pAig, p->vLeaves, p->vRoots, p->pVars2Q, p->pOrderL, 0, p->pPars->TimeTarget );
        if ( p->dd == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        //Extra_TestAndPerm( p->ddG, Cudd_Not(p->ddG->bFunc), p->ddG->bFunc2 );    

        // derive new states
        clk3 = Abc_Clock();
        p->ddG->bFunc2 = Cudd_bddAnd( p->ddG, bTemp = p->ddG->bFunc2, Cudd_Not(p->ddG->bFunc) );     
        if ( p->ddG->bFunc2 == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc2 );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        if ( Cudd_IsConstant(p->ddG->bFunc2) )
            break;
        // add to the reached set
        clk3 = Abc_Clock();
        p->ddG->bFunc = Cudd_bddOr( p->ddG, bTemp = p->ddG->bFunc, p->ddG->bFunc2 );                 
        if ( p->ddG->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->ddG->bFunc );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        p->timeGloba += Abc_Clock() - clk3;

        // reset permutation
//        RetValue = Cudd_CheckZeroRef( dd );
//        assert( RetValue == 0 );
//        Cudd_ShuffleHeap( dd, pOrderG );

        // move new states to the working manager
        clk3 = Abc_Clock();
        p->dd->bFunc = Extra_TransferPermute( p->ddG, p->dd, p->ddG->bFunc2, Vec_IntArray(p->vGlo2Cs) ); 
        if ( p->dd->bFunc == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Llb_NonlinImageQuit();
            return -1;
        }
        Cudd_Ref( p->dd->bFunc );
        p->timeTran2 += Abc_Clock() - clk3;

        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%3d : ",   nIters );
            printf( "Fr =%7d ",    nBddSize0 );
            printf( "Im =%7d  ",   nBddSize );
            printf( "(%4d %4d)  ", p->ddLocReos, p->ddLocGrbs );
            printf( "Rea =%6d  ",  Cudd_DagSize(p->ddG->bFunc) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            printf( "S =%4d ",     nSuppMax );
            printf( "cL =%5d ",    NumCmp );
            printf( "cG =%5d ",    Llb_NonlinCompPerms( p->ddG, p->pOrderG ) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clk2 );
            memcpy( p->pOrderG, p->ddG->perm, sizeof(int) * p->ddG->size );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(ddG, bReached, Saig_ManRegNum(pAig) );
//            Extra_bddPrint( ddG, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            Llb_NonlinImageQuit();
            return -1;
        }
    }
    Llb_NonlinImageQuit();
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, p->ddG->bFunc, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1; // unreachable
}